

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Dist::set(V2Dist *this,syVDist *para)

{
  float fVar1;
  float fVar2;
  syVFlt local_1c;
  
  this->mode = (int)para->mode;
  fVar1 = exp2f((para->ingain + -32.0) * 0.0625);
  this->gain1 = fVar1;
  switch(this->mode) {
  case 0:
    break;
  case 1:
    fVar2 = para->param1;
    fVar1 = atanf(fVar1);
    this->gain2 = (fVar2 * 0.0078125) / fVar1;
    this->offs = (para->param2 * 0.0078125 + -0.5) * (this->gain1 + this->gain1);
    break;
  case 2:
    fVar2 = para->param2;
    this->gain2 = para->param1 * 0.0078125;
    this->offs = (fVar2 * 0.0078125 + -0.5) * (fVar1 + fVar1);
    break;
  case 3:
    fVar2 = para->param1 * 256.0 + 1.0;
    this->crush2 = (int)fVar2;
    this->crush1 = fVar1 * (32768.0 / fVar2);
    this->crxor = (int)para->param2 << 9;
    break;
  case 4:
    fVar1 = exp2f((para->param1 * 0.0078125 + -1.0) * 10.0);
    this->dfreq = (int)(fVar1 * 2.1474836e+09) * 2;
    break;
  default:
    local_1c.cutoff = para->param1;
    local_1c.reso = para->param2;
    local_1c.mode = (float)(this->mode + -4);
    V2Flt::set(&this->fltl,&local_1c);
    V2Flt::set(&this->fltr,&local_1c);
  }
  return;
}

Assistant:

void set(const syVDist *para)
    {
        float x;

        mode = (int)para->mode;
        gain1 = powf(2.0f, (para->ingain - 32.0f) / 16.0f);

        switch (mode)
        {
        case OFF:
            break;

        case OVERDRIVE:
            gain2 = (para->param1 / 128.0f) / atan(gain1);
            offs = gain1 * 2.0f * ((para->param2 / 128.0f) - 0.5f);
            break;

        case CLIP:
            gain2 = para->param1 / 128.0f;
            offs = gain1 * 2.0f * ((para->param2 / 128.0f) - 0.5f);
            break;

        case BITCRUSHER:
            x = para->param1 * 256.0f + 1.0f;
            crush2 = (int)x;
            crush1 = gain1 * (32768.0f / x);
            crxor = ((int)para->param2) << 9;
            break;

        case DECIMATOR:
            dfreq = ftou32(calcfreq(para->param1 / 128.0f));
            break;

        default: // filters
        {
            syVFlt setup;
            setup.cutoff = para->param1;
            setup.reso = para->param2;
            setup.mode = (float)(mode - FLT_BASE);
            fltl.set(&setup);
            fltr.set(&setup);
        }
            break;
        }
    }